

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall Wasm::WasmBytecodeGenerator::EmitBr(WasmBytecodeGenerator *this)

{
  bool bVar1;
  WasmReaderBase *pWVar2;
  PolymorphicEmitInfo PVar3;
  undefined1 local_30 [8];
  PolymorphicEmitInfo info;
  BlockInfo *blockInfo;
  uint32 depth;
  WasmBytecodeGenerator *this_local;
  
  pWVar2 = GetReader(this);
  info.field_1.infos =
       (EmitInfo *)GetBlockInfo(this,(pWVar2->m_currentNode).field_1.brTable.numTargets);
  bVar1 = BlockInfo::HasYield((BlockInfo *)info.field_1.infos);
  if (bVar1) {
    PVar3 = PopStackPolymorphic(this,(BlockInfo *)info.field_1.infos,(char16 *)0x0);
    info._0_8_ = PVar3.field_1;
    local_30._0_4_ = PVar3.count;
    PVar3._4_4_ = 0;
    PVar3.count = local_30._0_4_;
    PVar3.field_1 =
         (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)
         (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)info._0_8_;
    YieldToBlock(this,(BlockInfo *)info.field_1.infos,PVar3);
    ReleaseLocation(this,(PolymorphicEmitInfo *)local_30);
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])
            (this->m_writer,(ulong)info.field_1.infos[4].type,0x25);
  SetUnreachableState(this,true);
  return;
}

Assistant:

void WasmBytecodeGenerator::EmitBr()
{
    uint32 depth = GetReader()->m_currentNode.br.depth;

    BlockInfo* blockInfo = GetBlockInfo(depth);
    if (blockInfo->HasYield())
    {
        PolymorphicEmitInfo info = PopStackPolymorphic(blockInfo);
        YieldToBlock(blockInfo, info);
        ReleaseLocation(&info);
    }
    m_writer->AsmBr(blockInfo->label);
    SetUnreachableState(true);
}